

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,char *filename)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  undefined1 local_90 [8];
  cmListFile listFile;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string filenametoread;
  char *filename_local;
  cmMakefile *this_local;
  
  filenametoread.field_2._8_8_ = filename;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,filename,&local_61);
  pcVar3 = GetCurrentSourceDirectory(this);
  cmsys::SystemTools::CollapseFullPath((string *)local_40,&local_60,pcVar3);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFileStack,(value_type *)local_40);
  cmListFile::cmListFile((cmListFile *)local_90);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmListFile::ParseFile((cmListFile *)local_90,pcVar3,false,this);
  if (bVar1) {
    PushPolicyBarrier(this);
    ReadListFile(this,(cmListFile *)local_90,(string *)local_40);
    bVar2 = cmSystemTools::GetFatalErrorOccured();
    PopPolicyBarrier(this,(bool)(~bVar2 & 1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(&this->ListFileStack);
  }
  cmListFile::~cmListFile((cmListFile *)local_90);
  std::__cxx11::string::~string((string *)local_40);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadListFile(const char* filename)
{
  std::string filenametoread =
    cmSystemTools::CollapseFullPath(filename,
                                    this->GetCurrentSourceDirectory());

  this->ListFileStack.push_back(filenametoread);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), false, this))
    {
    return false;
    }

  this->PushPolicyBarrier();
  this->ReadListFile(listFile, filenametoread);
  this->PopPolicyBarrier(!cmSystemTools::GetFatalErrorOccured());
  this->ListFileStack.pop_back();
  return true;
}